

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O2

void AGSSock::SockAddr_set_Address(SockAddr *sa,char *addr)

{
  addrinfo *__ai;
  int iVar1;
  long lVar2;
  string node;
  addrinfo *result;
  string service;
  addrinfo local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node,addr,(allocator<char> *)&local_48);
  service._M_dataplus._M_p = (pointer)&service.field_2;
  service._M_string_length = 0;
  service.field_2._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::find((char *)&node,0x10ef2a);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&node);
    std::__cxx11::string::operator=((string *)&service,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::substr((ulong)&local_48,(ulong)&node);
    std::__cxx11::string::operator=((string *)&node,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((sa->super_sockaddr_storage).ss_family != 10) {
    lVar2 = std::__cxx11::string::rfind((char)&node,0x3a);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)&node);
      std::__cxx11::string::operator=((string *)&service,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::resize((ulong)&node);
    }
  }
  result = (addrinfo *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_socktype = 0;
  local_48.ai_protocol = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_flags = (node._M_string_length == 0) + 0x28;
  local_48.ai_family = (int)(sa->super_sockaddr_storage).ss_family;
  iVar1 = getaddrinfo(node._M_dataplus._M_p,service._M_dataplus._M_p,&local_48,(addrinfo **)&result)
  ;
  __ai = result;
  if (iVar1 == 0 && result != (addrinfo *)0x0) {
    memcpy(sa,result->ai_addr,(ulong)result->ai_addrlen);
    freeaddrinfo((addrinfo *)__ai);
  }
  std::__cxx11::string::~string((string *)&service);
  std::__cxx11::string::~string((string *)&node);
  return;
}

Assistant:

void SockAddr_set_Address(SockAddr *sa, const char *addr)
{
	std::string node = addr, service;
	size_t index;
	
	if ((index = node.find("://")) != std::string::npos)
	{
		service = node.substr(0, index);
		node = node.substr(index + 3);
	}
	
	if ((sa->ss_family != AF_INET6)
	&& ((index = node.rfind(':')) != std::string::npos))
	{
		service = node.substr(index + 1);
		node.resize(index);
	}
	
	addrinfo hint, *result = nullptr;
	memset(&hint, 0, sizeof (addrinfo));
	hint.ai_flags = AI_ADDRCONFIG | AI_V4MAPPED | (node.empty() ? AI_PASSIVE : 0);
	hint.ai_family = sa->ss_family ? sa->ss_family : AF_UNSPEC;
	
	if (getaddrinfo(node.c_str(), service.c_str(), &hint, &result) || !result)
	{
		// Handle error:
		// We'll simply do nothing when address resolving failed;
		// Users will figure out that the address object is empty,
		// so the address string supplied is most likely invalid.
		return;
	}

	memcpy(sa, result->ai_addr, result->ai_addrlen);
	freeaddrinfo(result);
}